

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

State csv::parse(IDataSource *parser,FieldCallback *emitField,RecordCallback *emitRecord)

{
  pointer pcVar1;
  size_type sVar2;
  byte bVar3;
  pointer pfVar4;
  pointer pfVar5;
  _Any_data *p_Var6;
  int iVar7;
  _func_int **pp_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pfVar10;
  State SVar11;
  size_t sVar12;
  uint uVar13;
  bool bVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  record record;
  field field;
  record local_d8;
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  size_t local_88;
  _Any_data *local_80;
  FieldCallback *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  parser->cancelled = false;
  local_78 = emitField;
  iVar7 = (*parser->_vptr_IDataSource[2])();
  SVar11 = Complete;
  if ((char)iVar7 != '\0') {
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.row = 0;
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88 = 0;
    local_80 = (_Any_data *)emitRecord;
    do {
      pfVar5 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar4 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
          super__Vector_impl_data._M_start) {
        paVar9 = &((local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                    _M_impl.super__Vector_impl_data._M_start)->content).field_2;
        do {
          pcVar1 = (((string *)(paVar9 + -1))->_M_dataplus)._M_p;
          if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pcVar1) {
            operator_delete(pcVar1);
          }
          pfVar10 = (pointer)(paVar9 + 1);
          paVar9 = paVar9 + 3;
        } while (pfVar10 != pfVar5);
        local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar4;
      }
      local_d8.row = local_88;
      std::function<bool_(const_csv::field_&)>::function
                ((function<bool_(const_csv::field_&)> *)&local_70,local_78);
      local_b8._0_8_ = 0;
      local_b8._8_8_ = 0;
      local_a8._M_p = (pointer)&local_98;
      local_a0 = (char *)0x0;
      local_98._M_local_buf[0] = '\0';
      if (parser->cancelled == false) {
        bVar14 = true;
        sVar12 = 0;
LAB_00115e6f:
        (*parser->_vptr_IDataSource[9])(parser);
        if ((!bVar14) || (iVar7 = (*parser->_vptr_IDataSource[4])(parser), (char)iVar7 == '\0')) {
          if (parser->trimLeadingWhitespace == true) {
            do {
              iVar7 = (*parser->_vptr_IDataSource[6])(parser);
              if ((char)iVar7 == '\0') break;
              iVar7 = (*parser->_vptr_IDataSource[2])(parser);
            } while ((char)iVar7 != '\0');
          }
          iVar7 = (*parser->_vptr_IDataSource[8])(parser);
          uVar13 = 1;
          if ((char)iVar7 != '\0') goto LAB_00116030;
          iVar7 = (*parser->_vptr_IDataSource[7])(parser);
          if ((char)iVar7 == '\0') {
            do {
              if (parser->cancelled != false) goto LAB_0011602a;
              iVar7 = (*parser->_vptr_IDataSource[5])(parser);
              if ((char)iVar7 != '\0') goto LAB_001160e9;
              iVar7 = (*parser->_vptr_IDataSource[8])(parser);
              if ((char)iVar7 != '\0') goto LAB_00116030;
              iVar7 = (*parser->_vptr_IDataSource[7])(parser);
              pp_Var8 = parser->_vptr_IDataSource;
              if ((char)iVar7 != '\0') {
                iVar7 = (*pp_Var8[2])(parser);
                if ((char)iVar7 == '\0') break;
                iVar7 = (*parser->_vptr_IDataSource[7])(parser);
                pp_Var8 = parser->_vptr_IDataSource;
                if ((char)iVar7 == '\0') {
                  (*pp_Var8[3])(parser);
                  pp_Var8 = parser->_vptr_IDataSource;
                }
              }
              (*pp_Var8[10])(parser);
              iVar7 = (*parser->_vptr_IDataSource[2])(parser);
            } while ((char)iVar7 != '\0');
            goto LAB_00115fde;
          }
          iVar7 = (*parser->_vptr_IDataSource[2])(parser);
          while ((char)iVar7 != '\0') {
            if (parser->cancelled != false) goto LAB_0011602a;
            iVar7 = (*parser->_vptr_IDataSource[7])(parser);
            pp_Var8 = parser->_vptr_IDataSource;
            if ((char)iVar7 != '\0') {
              iVar7 = (*pp_Var8[2])(parser);
              if ((char)iVar7 == '\0') break;
              iVar7 = (*parser->_vptr_IDataSource[7])(parser);
              if ((char)iVar7 == '\0') goto LAB_00115fe6;
              pp_Var8 = parser->_vptr_IDataSource;
            }
            (*pp_Var8[10])(parser);
            iVar7 = (*parser->_vptr_IDataSource[2])(parser);
          }
          goto LAB_0011601a;
        }
        do {
          iVar7 = (*parser->_vptr_IDataSource[8])(parser);
          if ((char)iVar7 != '\0') {
            uVar13 = 1;
            goto LAB_00116030;
          }
          iVar7 = (*parser->_vptr_IDataSource[2])(parser);
        } while ((char)iVar7 != '\0');
LAB_00115fde:
        uVar13 = 2;
        goto LAB_00116030;
      }
LAB_00115e5e:
      uVar13 = 3;
LAB_00116140:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p);
      }
      p_Var6 = local_80;
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      if (parser->skipBlankLines == true) {
        bVar14 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar14) {
          sVar2 = ((local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                    _M_impl.super__Vector_impl_data._M_start)->content)._M_string_length;
          pfVar4 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          while (sVar2 == 0) {
            bVar14 = pfVar4 + 1 ==
                     local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (bVar14) break;
            sVar2 = pfVar4[1].content._M_string_length;
            pfVar4 = pfVar4 + 1;
          }
        }
        if (!bVar14) goto LAB_001161ae;
      }
      else {
LAB_001161ae:
        local_88 = local_88 + 1;
        if (*(long *)(p_Var6 + 1) != 0) {
          (*parser->_vptr_IDataSource[0xc])(parser);
          local_b8._0_8_ = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          if (*(long *)(p_Var6 + 1) == 0) {
            std::__throw_bad_function_call();
            goto LAB_00116236;
          }
          bVar14 = (**(code **)((long)p_Var6 + 0x18))(p_Var6,&local_d8,(double *)local_b8);
          if (!bVar14) goto LAB_0011620f;
        }
      }
      iVar7 = (*parser->_vptr_IDataSource[2])(parser);
      SVar11 = Complete;
      if ((char)iVar7 == '\0') goto LAB_00116212;
    } while (uVar13 < 2);
    SVar11 = Cancelled;
    if (uVar13 != 3) {
      if (uVar13 != 2) {
LAB_00116236:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dagronf[P]csvlib/csvlib/csv/parser.cpp"
                      ,0x111,"State csv::parse(IDataSource &, FieldCallback, RecordCallback)");
      }
LAB_0011620f:
      SVar11 = Complete;
    }
LAB_00116212:
    std::vector<csv::field,_std::allocator<csv::field>_>::~vector(&local_d8.content);
  }
  return SVar11;
LAB_0011602a:
  uVar13 = 3;
LAB_00116030:
  bVar3 = 0;
LAB_00116032:
  if (parser->cancelled != false) goto LAB_00115e5e;
  (*parser->_vptr_IDataSource[0xb])((string *)local_50,parser);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_b8._0_8_ = local_d8.row;
  local_b8._8_8_ = sVar12;
  std::vector<csv::field,_std::allocator<csv::field>_>::push_back
            (&local_d8.content,(value_type *)local_b8);
  if (local_60 == (code *)0x0) {
    if (bVar3 == 0) goto LAB_00116140;
  }
  else {
    bVar14 = (*local_58)(&local_70,(value_type *)local_b8);
    if ((bVar3 & bVar14) == 0) {
      if (!bVar14) {
        uVar13 = 2;
      }
      goto LAB_00116140;
    }
  }
  iVar7 = (*parser->_vptr_IDataSource[5])(parser);
  if (((char)iVar7 == '\0') ||
     (iVar7 = (*parser->_vptr_IDataSource[2])(parser), (char)iVar7 == '\0')) {
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_a0,0x1170ac);
    local_b8._8_8_ = sVar12 + 1;
    local_b8._0_8_ = local_d8.row;
    uVar13 = 2;
    std::vector<csv::field,_std::allocator<csv::field>_>::push_back
              (&local_d8.content,(value_type *)local_b8);
    goto LAB_00116140;
  }
  sVar12 = sVar12 + 1;
  bVar14 = false;
  if (parser->cancelled != false) goto LAB_00115e5e;
  goto LAB_00115e6f;
  while( true ) {
    iVar7 = (*parser->_vptr_IDataSource[5])(parser);
    if ((char)iVar7 != '\0') goto LAB_001160e9;
    iVar7 = (*parser->_vptr_IDataSource[2])(parser);
    if ((char)iVar7 == '\0') break;
LAB_00115fe6:
    iVar7 = (*parser->_vptr_IDataSource[8])(parser);
    if ((char)iVar7 != '\0') goto LAB_00116030;
  }
LAB_0011601a:
  bVar3 = 0;
  uVar13 = 2;
  goto LAB_00116032;
LAB_001160e9:
  uVar13 = 0;
  bVar3 = 1;
  goto LAB_00116032;
}

Assistant:

State parse(IDataSource& parser, FieldCallback emitField, RecordCallback emitRecord) {
		//  file = [header CRLF] record *(CRLF record) [CRLF]

		InternalState state = InternalState::EndOfFile;
		parser.cancelled = false;

		// Move to the first character
		if (!parser.next()) {
			// File is empty.  Do nothing
			return State::Complete;
		}

		csv::record record;

		size_t row = 0;
		do {
			record.content.clear();
			record.row = row;

			state = parseRecord(parser, record, emitField);

			if (!parser.skipBlankLines || !record.empty()) {
				row++;
				if (emitRecord && (emitRecord(record, parser.progress()) == false)) {
					return State::Complete;
				}
			}

			if (!parser.next()) {
				return State::Complete;
			}
		}
		while (state != InternalState::Canceled && state != InternalState::EndOfFile);

		switch (state) {
			case InternalState::Canceled:
				return State::Cancelled;
			case InternalState::EndOfFile:
				return State::Complete;
			default:
				assert(false);
				return State::Error;
		}
	}